

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntlm.c
# Opt level: O0

CURLcode Curl_auth_create_ntlm_type3_message
                   (Curl_easy *data,char *userp,char *passwdp,ntlmdata *ntlm,char **outptr,
                   size_t *outlen)

{
  char *pcVar1;
  int iVar2;
  CURLcode CVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  uchar local_9e8 [8];
  uchar lmbuffer [24];
  uchar local_9c8 [8];
  uchar ntbuffer_2 [24];
  uint entropy_1 [2];
  uchar md5sum [16];
  uchar tmp [24];
  uchar local_978 [8];
  uchar ntbuffer_1 [24];
  uchar local_958 [8];
  uchar ntlmv2hash [24];
  uint entropy [2];
  uchar ntbuffer [24];
  size_t local_918;
  size_t domlen;
  size_t userlen;
  size_t hostlen;
  size_t domoff;
  size_t useroff;
  size_t hostoff;
  char *domain;
  char *user;
  char host [1025];
  uchar *puStack_4c8;
  _Bool unicode;
  uchar *ntlmv2resp;
  uchar *ptr_ntresp;
  uchar ntresp [24];
  uint ntresplen;
  int ntrespoff;
  uchar lmresp [24];
  uchar local_478 [4];
  int lmrespoff;
  uchar ntlmbuf [1024];
  size_t size;
  CURLcode result;
  size_t *outlen_local;
  char **outptr_local;
  ntlmdata *ntlm_local;
  char *passwdp_local;
  char *userp_local;
  Curl_easy *data_local;
  
  ntresp[0x10] = '\x18';
  ntresp[0x11] = '\0';
  ntresp[0x12] = '\0';
  ntresp[0x13] = '\0';
  ntlmv2resp = (uchar *)&ptr_ntresp;
  puStack_4c8 = (uchar *)0x0;
  bVar6 = (ntlm->flags & 1) != 0;
  memset(&user,0,0x401);
  hostoff = (long)"user=%s\x01host=%s\x01port=%ld\x01auth=Bearer %s\x01\x01" + 0x29;
  domlen = 0;
  local_918 = 0;
  domain = strchr(userp,0x5c);
  if (domain == (char *)0x0) {
    domain = strchr(userp,0x2f);
  }
  pcVar1 = userp;
  if (domain != (char *)0x0) {
    local_918 = (long)domain - (long)userp;
    hostoff = (size_t)userp;
    pcVar1 = domain + 1;
  }
  domain = pcVar1;
  if (domain != (char *)0x0) {
    domlen = strlen(domain);
  }
  iVar2 = Curl_gethostname((char *)&user,0x401);
  if (iVar2 == 0) {
    userlen = strlen((char *)&user);
  }
  else {
    Curl_infof(data,"gethostname() failed, continuing without!\n");
    userlen = 0;
  }
  if (ntlm->target_info_len == 0) {
    if ((ntlm->flags & 0x80000) == 0) {
      CVar3 = Curl_ntlm_core_mk_nt_hash(data,passwdp,local_9c8);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      Curl_ntlm_core_lm_resp(local_9c8,ntlm->nonce,(uchar *)&ptr_ntresp);
      CVar3 = Curl_ntlm_core_mk_lm_hash(data,passwdp,local_9e8);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      Curl_ntlm_core_lm_resp(local_9e8,ntlm->nonce,(uchar *)&ntresplen);
    }
    else {
      CVar3 = Curl_rand(data,(uint *)(ntbuffer_2 + 0x10),2);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      ntresplen._0_1_ = ntbuffer_2[0x10];
      ntresplen._1_1_ = ntbuffer_2[0x11];
      ntresplen._2_1_ = ntbuffer_2[0x12];
      ntresplen._3_1_ = ntbuffer_2[0x13];
      ntrespoff._0_1_ = ntbuffer_2[0x14];
      ntrespoff._1_1_ = ntbuffer_2[0x15];
      ntrespoff._2_1_ = ntbuffer_2[0x16];
      ntrespoff._3_1_ = ntbuffer_2[0x17];
      memset(lmresp,0,0x10);
      md5sum._8_8_ = *(undefined8 *)ntlm->nonce;
      size._4_4_ = Curl_ssl_md5sum(md5sum + 8,0x10,(uchar *)entropy_1,0x10);
      if (size._4_4_ == CURLE_OK) {
        size._4_4_ = Curl_ntlm_core_mk_nt_hash(data,passwdp,local_978);
      }
      if (size._4_4_ != CURLE_OK) {
        return size._4_4_;
      }
      Curl_ntlm_core_lm_resp(local_978,(uchar *)entropy_1,(uchar *)&ptr_ntresp);
    }
  }
  else {
    CVar3 = Curl_rand(data,(uint *)(ntlmv2hash + 0x10),2);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    CVar3 = Curl_ntlm_core_mk_nt_hash(data,passwdp,(uchar *)entropy);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    CVar3 = Curl_ntlm_core_mk_ntlmv2_hash
                      (domain,domlen,(char *)hostoff,local_918,(uchar *)entropy,local_958);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    CVar3 = Curl_ntlm_core_mk_lmv2_resp(local_958,ntlmv2hash + 0x10,ntlm->nonce,(uchar *)&ntresplen)
    ;
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    CVar3 = Curl_ntlm_core_mk_ntlmv2_resp
                      (local_958,ntlmv2hash + 0x10,ntlm,&stack0xfffffffffffffb38,
                       (uint *)(ntresp + 0x10));
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    ntlmv2resp = puStack_4c8;
  }
  if (bVar6) {
    local_918 = local_918 << 1;
    domlen = domlen << 1;
    userlen = userlen << 1;
  }
  lmresp[0x14] = '@';
  lmresp[0x15] = '\0';
  lmresp[0x16] = '\0';
  lmresp[0x17] = '\0';
  ntresp[0x14] = 'X';
  ntresp[0x15] = '\0';
  ntresp[0x16] = '\0';
  ntresp[0x17] = '\0';
  uVar4 = ntresp._16_4_ + 0x58;
  uVar5 = uVar4 + local_918;
  iVar2 = curl_msnprintf((char *)local_478,0x400,
                         "NTLMSSP%c\x03%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c"
                         ,0,0,0,0,0x18,0,0x18,0,0x40,0,0,0,ntresp._16_4_ & 0xff,
                         (uint)ntresp._16_4_ >> 8 & 0xff,ntresp._16_4_ & 0xff,
                         (uint)ntresp._16_4_ >> 8 & 0xff,0x58,0,0,0,local_918 & 0xff,
                         local_918 >> 8 & 0xff,local_918 & 0xff,local_918 >> 8 & 0xff,
                         (ulong)uVar4 & 0xff,(ulong)(uVar4 >> 8) & 0xff,0,0,domlen & 0xff,
                         domlen >> 8 & 0xff,domlen & 0xff,domlen >> 8 & 0xff,uVar5 & 0xff,
                         uVar5 >> 8 & 0xff,0,0,userlen & 0xff,userlen >> 8 & 0xff,userlen & 0xff,
                         userlen >> 8 & 0xff,uVar5 + domlen & 0xff,uVar5 + domlen >> 8 & 0xff,0,0,0,
                         0,0,0,0,0,0,0,ntlm->flags & 0xff,ntlm->flags >> 8 & 0xff,
                         ntlm->flags >> 0x10 & 0xff,ntlm->flags >> 0x18);
  ntlmbuf._1016_8_ = SEXT48(iVar2);
  if ((ulong)ntlmbuf._1016_8_ < 1000) {
    *(undefined8 *)(local_478 + ntlmbuf._1016_8_) = _ntresplen;
    *(undefined8 *)(ntlmbuf + ntlmbuf._1016_8_) = lmresp._0_8_;
    *(undefined8 *)(ntlmbuf + ntlmbuf._1016_8_ + 8) = lmresp._8_8_;
    ntlmbuf._1016_8_ = ntlmbuf._1016_8_ + 0x18;
  }
  if ((ulong)ntlmbuf._1016_8_ < (ulong)(0x400 - ntresp._16_4_)) {
    memcpy(local_478 + ntlmbuf._1016_8_,ntlmv2resp,(ulong)(uint)ntresp._16_4_);
    ntlmbuf._1016_8_ = (ulong)(uint)ntresp._16_4_ + ntlmbuf._1016_8_;
  }
  (*Curl_cfree)(puStack_4c8);
  if (ntlmbuf._1016_8_ + domlen + local_918 + userlen < 0x400) {
    if (bVar6) {
      unicodecpy(local_478 + ntlmbuf._1016_8_,(char *)hostoff,local_918 >> 1);
    }
    else {
      memcpy(local_478 + ntlmbuf._1016_8_,(void *)hostoff,local_918);
    }
    ntlmbuf._1016_8_ = local_918 + ntlmbuf._1016_8_;
    if (bVar6) {
      unicodecpy(local_478 + ntlmbuf._1016_8_,domain,domlen >> 1);
    }
    else {
      memcpy(local_478 + ntlmbuf._1016_8_,domain,domlen);
    }
    ntlmbuf._1016_8_ = domlen + ntlmbuf._1016_8_;
    if (bVar6) {
      unicodecpy(local_478 + ntlmbuf._1016_8_,(char *)&user,userlen >> 1);
    }
    else {
      memcpy(local_478 + ntlmbuf._1016_8_,&user,userlen);
    }
    ntlmbuf._1016_8_ = userlen + ntlmbuf._1016_8_;
    data_local._4_4_ =
         Curl_base64_encode((Curl_easy *)0x0,(char *)local_478,ntlmbuf._1016_8_,outptr,outlen);
    Curl_auth_ntlm_cleanup(ntlm);
  }
  else {
    Curl_failf(data,"user + domain + host name too big");
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_auth_create_ntlm_type3_message(struct Curl_easy *data,
                                             const char *userp,
                                             const char *passwdp,
                                             struct ntlmdata *ntlm,
                                             char **outptr, size_t *outlen)

{
  /* NTLM type-3 message structure:

          Index  Description            Content
            0    NTLMSSP Signature      Null-terminated ASCII "NTLMSSP"
                                        (0x4e544c4d53535000)
            8    NTLM Message Type      long (0x03000000)
           12    LM/LMv2 Response       security buffer
           20    NTLM/NTLMv2 Response   security buffer
           28    Target Name            security buffer
           36    User Name              security buffer
           44    Workstation Name       security buffer
          (52)   Session Key            security buffer (*)
          (60)   Flags                  long (*)
          (64)   OS Version Structure   8 bytes (*)
  52 (64) (72)   Start of data block
                                          (*) -> Optional
  */

  CURLcode result = CURLE_OK;
  size_t size;
  unsigned char ntlmbuf[NTLM_BUFSIZE];
  int lmrespoff;
  unsigned char lmresp[24]; /* fixed-size */
#if USE_NTRESPONSES
  int ntrespoff;
  unsigned int ntresplen = 24;
  unsigned char ntresp[24]; /* fixed-size */
  unsigned char *ptr_ntresp = &ntresp[0];
  unsigned char *ntlmv2resp = NULL;
#endif
  bool unicode = (ntlm->flags & NTLMFLAG_NEGOTIATE_UNICODE) ? TRUE : FALSE;
  char host[HOSTNAME_MAX + 1] = "";
  const char *user;
  const char *domain = "";
  size_t hostoff = 0;
  size_t useroff = 0;
  size_t domoff = 0;
  size_t hostlen = 0;
  size_t userlen = 0;
  size_t domlen = 0;

  user = strchr(userp, '\\');
  if(!user)
    user = strchr(userp, '/');

  if(user) {
    domain = userp;
    domlen = (user - domain);
    user++;
  }
  else
    user = userp;

  if(user)
    userlen = strlen(user);

  /* Get the machine's un-qualified host name as NTLM doesn't like the fully
     qualified domain name */
  if(Curl_gethostname(host, sizeof(host))) {
    infof(data, "gethostname() failed, continuing without!\n");
    hostlen = 0;
  }
  else {
    hostlen = strlen(host);
  }

#if USE_NTRESPONSES && USE_NTLM_V2
  if(ntlm->target_info_len) {
    unsigned char ntbuffer[0x18];
    unsigned int entropy[2];
    unsigned char ntlmv2hash[0x18];

    result = Curl_rand(data, &entropy[0], 2);
    if(result)
      return result;

    result = Curl_ntlm_core_mk_nt_hash(data, passwdp, ntbuffer);
    if(result)
      return result;

    result = Curl_ntlm_core_mk_ntlmv2_hash(user, userlen, domain, domlen,
                                           ntbuffer, ntlmv2hash);
    if(result)
      return result;

    /* LMv2 response */
    result = Curl_ntlm_core_mk_lmv2_resp(ntlmv2hash,
                                         (unsigned char *)&entropy[0],
                                         &ntlm->nonce[0], lmresp);
    if(result)
      return result;

    /* NTLMv2 response */
    result = Curl_ntlm_core_mk_ntlmv2_resp(ntlmv2hash,
                                           (unsigned char *)&entropy[0],
                                           ntlm, &ntlmv2resp, &ntresplen);
    if(result)
      return result;

    ptr_ntresp = ntlmv2resp;
  }
  else
#endif

#if USE_NTRESPONSES && USE_NTLM2SESSION
  /* We don't support NTLM2 if we don't have USE_NTRESPONSES */
  if(ntlm->flags & NTLMFLAG_NEGOTIATE_NTLM2_KEY) {
    unsigned char ntbuffer[0x18];
    unsigned char tmp[0x18];
    unsigned char md5sum[MD5_DIGEST_LENGTH];
    unsigned int entropy[2];

    /* Need to create 8 bytes random data */
    result = Curl_rand(data, &entropy[0], 2);
    if(result)
      return result;

    /* 8 bytes random data as challenge in lmresp */
    memcpy(lmresp, entropy, 8);

    /* Pad with zeros */
    memset(lmresp + 8, 0, 0x10);

    /* Fill tmp with challenge(nonce?) + entropy */
    memcpy(tmp, &ntlm->nonce[0], 8);
    memcpy(tmp + 8, entropy, 8);

    result = Curl_ssl_md5sum(tmp, 16, md5sum, MD5_DIGEST_LENGTH);
    if(!result)
      /* We shall only use the first 8 bytes of md5sum, but the des code in
         Curl_ntlm_core_lm_resp only encrypt the first 8 bytes */
      result = Curl_ntlm_core_mk_nt_hash(data, passwdp, ntbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(ntbuffer, md5sum, ntresp);

    /* End of NTLM2 Session code */

  }
  else
#endif
  {

#if USE_NTRESPONSES
    unsigned char ntbuffer[0x18];
#endif
    unsigned char lmbuffer[0x18];

#if USE_NTRESPONSES
    result = Curl_ntlm_core_mk_nt_hash(data, passwdp, ntbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(ntbuffer, &ntlm->nonce[0], ntresp);
#endif

    result = Curl_ntlm_core_mk_lm_hash(data, passwdp, lmbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(lmbuffer, &ntlm->nonce[0], lmresp);

    /* A safer but less compatible alternative is:
     *   Curl_ntlm_core_lm_resp(ntbuffer, &ntlm->nonce[0], lmresp);
     * See https://davenport.sourceforge.io/ntlm.html#ntlmVersion2 */
  }

  if(unicode) {
    domlen = domlen * 2;
    userlen = userlen * 2;
    hostlen = hostlen * 2;
  }

  lmrespoff = 64; /* size of the message header */
#if USE_NTRESPONSES
  ntrespoff = lmrespoff + 0x18;
  domoff = ntrespoff + ntresplen;
#else
  domoff = lmrespoff + 0x18;
#endif
  useroff = domoff + domlen;
  hostoff = useroff + userlen;

  /* Create the big type-3 message binary blob */
  size = snprintf((char *)ntlmbuf, NTLM_BUFSIZE,
                  NTLMSSP_SIGNATURE "%c"
                  "\x03%c%c%c"  /* 32-bit type = 3 */

                  "%c%c"  /* LanManager length */
                  "%c%c"  /* LanManager allocated space */
                  "%c%c"  /* LanManager offset */
                  "%c%c"  /* 2 zeroes */

                  "%c%c"  /* NT-response length */
                  "%c%c"  /* NT-response allocated space */
                  "%c%c"  /* NT-response offset */
                  "%c%c"  /* 2 zeroes */

                  "%c%c"  /* domain length */
                  "%c%c"  /* domain allocated space */
                  "%c%c"  /* domain name offset */
                  "%c%c"  /* 2 zeroes */

                  "%c%c"  /* user length */
                  "%c%c"  /* user allocated space */
                  "%c%c"  /* user offset */
                  "%c%c"  /* 2 zeroes */

                  "%c%c"  /* host length */
                  "%c%c"  /* host allocated space */
                  "%c%c"  /* host offset */
                  "%c%c"  /* 2 zeroes */

                  "%c%c"  /* session key length (unknown purpose) */
                  "%c%c"  /* session key allocated space (unknown purpose) */
                  "%c%c"  /* session key offset (unknown purpose) */
                  "%c%c"  /* 2 zeroes */

                  "%c%c%c%c",  /* flags */

                  /* domain string */
                  /* user string */
                  /* host string */
                  /* LanManager response */
                  /* NT response */

                  0,                /* zero termination */
                  0, 0, 0,          /* type-3 long, the 24 upper bits */

                  SHORTPAIR(0x18),  /* LanManager response length, twice */
                  SHORTPAIR(0x18),
                  SHORTPAIR(lmrespoff),
                  0x0, 0x0,

#if USE_NTRESPONSES
                  SHORTPAIR(ntresplen),  /* NT-response length, twice */
                  SHORTPAIR(ntresplen),
                  SHORTPAIR(ntrespoff),
                  0x0, 0x0,
#else
                  0x0, 0x0,
                  0x0, 0x0,
                  0x0, 0x0,
                  0x0, 0x0,
#endif
                  SHORTPAIR(domlen),
                  SHORTPAIR(domlen),
                  SHORTPAIR(domoff),
                  0x0, 0x0,

                  SHORTPAIR(userlen),
                  SHORTPAIR(userlen),
                  SHORTPAIR(useroff),
                  0x0, 0x0,

                  SHORTPAIR(hostlen),
                  SHORTPAIR(hostlen),
                  SHORTPAIR(hostoff),
                  0x0, 0x0,

                  0x0, 0x0,
                  0x0, 0x0,
                  0x0, 0x0,
                  0x0, 0x0,

                  LONGQUARTET(ntlm->flags));

  DEBUGASSERT(size == 64);
  DEBUGASSERT(size == (size_t)lmrespoff);

  /* We append the binary hashes */
  if(size < (NTLM_BUFSIZE - 0x18)) {
    memcpy(&ntlmbuf[size], lmresp, 0x18);
    size += 0x18;
  }

  DEBUG_OUT({
    fprintf(stderr, "**** TYPE3 header lmresp=");
    ntlm_print_hex(stderr, (char *)&ntlmbuf[lmrespoff], 0x18);
  });

#if USE_NTRESPONSES
  if(size < (NTLM_BUFSIZE - ntresplen)) {
    DEBUGASSERT(size == (size_t)ntrespoff);
    memcpy(&ntlmbuf[size], ptr_ntresp, ntresplen);
    size += ntresplen;
  }

  DEBUG_OUT({
    fprintf(stderr, "\n   ntresp=");
    ntlm_print_hex(stderr, (char *)&ntlmbuf[ntrespoff], ntresplen);
  });

  free(ntlmv2resp);/* Free the dynamic buffer allocated for NTLMv2 */

#endif

  DEBUG_OUT({
    fprintf(stderr, "\n   flags=0x%02.2x%02.2x%02.2x%02.2x 0x%08.8x ",
            LONGQUARTET(ntlm->flags), ntlm->flags);
    ntlm_print_flags(stderr, ntlm->flags);
    fprintf(stderr, "\n****\n");
  });

  /* Make sure that the domain, user and host strings fit in the
     buffer before we copy them there. */
  if(size + userlen + domlen + hostlen >= NTLM_BUFSIZE) {
    failf(data, "user + domain + host name too big");
    return CURLE_OUT_OF_MEMORY;
  }

  DEBUGASSERT(size == domoff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], domain, domlen / 2);
  else
    memcpy(&ntlmbuf[size], domain, domlen);

  size += domlen;

  DEBUGASSERT(size == useroff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], user, userlen / 2);
  else
    memcpy(&ntlmbuf[size], user, userlen);

  size += userlen;

  DEBUGASSERT(size == hostoff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], host, hostlen / 2);
  else
    memcpy(&ntlmbuf[size], host, hostlen);

  size += hostlen;

  /* Convert domain, user, and host to ASCII but leave the rest as-is */
  result = Curl_convert_to_network(data, (char *)&ntlmbuf[domoff],
                                   size - domoff);
  if(result)
    return CURLE_CONV_FAILED;

  /* Return with binary blob encoded into base64 */
  result = Curl_base64_encode(NULL, (char *)ntlmbuf, size, outptr, outlen);

  Curl_auth_ntlm_cleanup(ntlm);

  return result;
}